

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int jsonParseValue(JsonParse *pParse,u32 i)

{
  u8 *puVar1;
  byte bVar2;
  byte bVar3;
  char *pcVar4;
  bool bVar5;
  byte bVar6;
  long lVar7;
  ushort uVar8;
  int iVar9;
  char cVar10;
  ulong uVar11;
  u32 uVar12;
  uint uVar13;
  u8 uVar14;
  int iVar15;
  uint uVar17;
  long lVar18;
  uint uVar19;
  char *__s1;
  ulong uVar16;
  
  pcVar4 = pParse->zJson;
  uVar11 = (ulong)i;
  do {
    uVar16 = uVar11;
    iVar15 = (int)uVar16;
    bVar2 = pcVar4[uVar16];
    uVar19 = iVar15 + 1;
    uVar11 = (ulong)uVar19;
  } while (""[bVar2] != '\0');
  if (bVar2 == 0x7b) {
    uVar19 = jsonParseAddNode(pParse,7,0,(char *)0x0);
    if (-1 < (int)uVar19) {
      while( true ) {
        do {
          iVar15 = (int)uVar16;
          uVar17 = iVar15 + 1;
          uVar16 = (ulong)uVar17;
        } while (""[(byte)pcVar4[uVar16]] != '\0');
        uVar8 = pParse->iDepth + 1;
        pParse->iDepth = uVar8;
        if (2000 < uVar8) break;
        uVar17 = jsonParseValue(pParse,uVar17);
        if ((int)uVar17 < 0) {
          pParse->iDepth = pParse->iDepth - 1;
          if (uVar17 != 0xfffffffe) {
            return -1;
          }
          if (pParse->nNode != uVar19 + 1) {
            return -1;
          }
          return iVar15 + 2;
        }
        if (pParse->oom != '\0') {
          return -1;
        }
        uVar13 = pParse->nNode - 1;
        if (pParse->aNode[uVar13].eType != '\x05') {
          return -1;
        }
        puVar1 = &pParse->aNode[uVar13].jnFlags;
        *puVar1 = *puVar1 | 0x40;
        do {
          uVar11 = (ulong)uVar17;
          uVar17 = uVar17 + 1;
        } while (""[(byte)pcVar4[uVar11]] != '\0');
        if (pcVar4[uVar11] != 0x3a) {
          return -1;
        }
        uVar17 = jsonParseValue(pParse,uVar17);
        pParse->iDepth = pParse->iDepth - 1;
        if ((int)uVar17 < 0) {
          return -1;
        }
        do {
          uVar13 = uVar17;
          bVar2 = pcVar4[uVar13];
          uVar17 = uVar13 + 1;
        } while (""[bVar2] != '\0');
        uVar16 = (ulong)uVar13;
        if (bVar2 != 0x2c) {
          if (bVar2 != 0x7d) {
            return -1;
          }
          pParse->aNode[uVar19].n = ~uVar19 + pParse->nNode;
          return uVar13 + 1;
        }
      }
    }
  }
  else if (bVar2 == 0x5b) {
    uVar19 = jsonParseAddNode(pParse,6,0,(char *)0x0);
    if (-1 < (int)uVar19) {
      pParse->aNode[uVar19].u.zJContent = (char *)0x0;
      while( true ) {
        do {
          iVar15 = (int)uVar16;
          uVar17 = iVar15 + 1;
          uVar16 = (ulong)uVar17;
        } while (""[(byte)pcVar4[uVar16]] != '\0');
        uVar8 = pParse->iDepth + 1;
        pParse->iDepth = uVar8;
        if (2000 < uVar8) break;
        uVar17 = jsonParseValue(pParse,uVar17);
        pParse->iDepth = pParse->iDepth - 1;
        if ((int)uVar17 < 0) {
          if (uVar17 != 0xfffffffd) {
            return -1;
          }
          if (pParse->nNode != uVar19 + 1) {
            return -1;
          }
          return iVar15 + 2;
        }
        do {
          uVar13 = uVar17;
          bVar2 = pcVar4[uVar13];
          uVar17 = uVar13 + 1;
        } while (""[bVar2] != '\0');
        uVar16 = (ulong)uVar13;
        if (bVar2 != 0x2c) {
          if (bVar2 != 0x5d) {
            return -1;
          }
          pParse->aNode[uVar19].n = ~uVar19 + pParse->nNode;
          return uVar13 + 1;
        }
      }
    }
  }
  else {
    __s1 = pcVar4 + uVar16;
    if (bVar2 == 0x66) {
      iVar9 = strncmp(__s1,"false",5);
      if ((iVar9 == 0) && (uVar17 = iVar15 + 5, (""[(byte)pcVar4[uVar17]] & 6) == 0)) {
        uVar12 = 2;
LAB_001bf46a:
        jsonParseAddNode(pParse,uVar12,0,(char *)0x0);
        return uVar17;
      }
    }
    else if (bVar2 == 0x6e) {
      iVar9 = strncmp(__s1,"null",4);
      if ((iVar9 == 0) && (uVar17 = iVar15 + 4, (""[(byte)pcVar4[uVar17]] & 6) == 0)) {
        uVar12 = 0;
        goto LAB_001bf46a;
      }
    }
    else if (bVar2 == 0x74) {
      iVar9 = strncmp(__s1,"true",4);
      if ((iVar9 == 0) && (uVar17 = iVar15 + 4, (""[(byte)pcVar4[uVar17]] & 6) == 0)) {
        uVar12 = 1;
        goto LAB_001bf46a;
      }
    }
    else if (bVar2 == 0x22) {
      uVar14 = '\0';
switchD_001bf08e_caseD_6e:
      do {
        while( true ) {
          iVar15 = (int)uVar16;
          uVar16 = (ulong)(iVar15 + 1);
          bVar2 = pcVar4[uVar16];
          if (bVar2 < 0x20) {
            return -1;
          }
          if (bVar2 == 0x5c) break;
          if (bVar2 == 0x22) {
            jsonParseAddNode(pParse,5,(iVar15 - uVar19) + 3,__s1);
            if (pParse->oom != '\0') {
              return iVar15 + 2;
            }
            pParse->aNode[pParse->nNode - 1].jnFlags = uVar14;
            return iVar15 + 2;
          }
        }
        uVar16 = (ulong)(iVar15 + 2);
        bVar2 = pcVar4[uVar16];
        uVar14 = '\x02';
      } while ((bVar2 - 0x2f < 0x38) &&
              ((0x88200000000001U >> ((ulong)(bVar2 - 0x2f) & 0x3f) & 1) != 0));
      switch(bVar2) {
      case 0x6e:
      case 0x72:
      case 0x74:
        goto switchD_001bf08e_caseD_6e;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
        goto switchD_001bf08e_caseD_6f;
      case 0x75:
        lVar18 = 0;
        while (lVar18 != 4) {
          lVar7 = lVar18 + uVar16 + 1;
          lVar18 = lVar18 + 1;
          if ((""[(byte)pcVar4[lVar7]] & 8) == 0) {
            return -1;
          }
        }
        goto switchD_001bf08e_caseD_6e;
      default:
        if (bVar2 != 0x22) {
          return -1;
        }
        goto switchD_001bf08e_caseD_6e;
      }
    }
    if (bVar2 == 0x2d || (byte)(bVar2 - 0x30) < 10) {
      if (((0x30 < bVar2) || (pcVar4[((bVar2 == 0x2d) + uVar19) - 1] != '0')) ||
         (9 < (byte)(pcVar4[(bVar2 == 0x2d) + uVar19] - 0x30U))) {
        bVar2 = 1;
        bVar6 = bVar2;
        while( true ) {
          while( true ) {
            uVar12 = ((int)uVar16 - uVar19) + 1;
            do {
              uVar11 = uVar16;
              iVar15 = (int)uVar11;
              uVar16 = (ulong)(iVar15 + 1U);
              bVar3 = pcVar4[uVar16];
              uVar12 = uVar12 + 1;
            } while ((byte)(bVar3 - 0x30) < 10);
            if (bVar3 != 0x2e) break;
            bVar5 = (bool)(pcVar4[uVar11] != '-' & bVar2);
            bVar2 = 0;
            if (!bVar5) {
              return -1;
            }
          }
          if ((bVar3 & 0xdf) != 0x45) {
            if (pcVar4[uVar11] < '0') {
              return -1;
            }
            jsonParseAddNode(pParse,4 - bVar2,uVar12,__s1);
            return iVar15 + 1U;
          }
          if ((~bVar6 & 1) != 0 || pcVar4[uVar11] < '0') break;
          cVar10 = pcVar4[iVar15 + 2];
          if ((cVar10 == '-') || (cVar10 == '+')) {
            cVar10 = pcVar4[iVar15 + 3];
            uVar16 = (ulong)(iVar15 + 2);
          }
          bVar2 = 0;
          bVar6 = bVar2;
          if ((byte)(cVar10 - 0x3aU) < 0xf6) {
            return -1;
          }
        }
        return -1;
      }
    }
    else {
      if (bVar2 == 0) {
        return 0;
      }
      if (bVar2 == 0x7d) {
        return -2;
      }
      if (bVar2 == 0x5d) {
        return -3;
      }
    }
  }
switchD_001bf08e_caseD_6f:
  return -1;
}

Assistant:

static int jsonParseValue(JsonParse *pParse, u32 i){
  char c;
  u32 j;
  int iThis;
  int x;
  JsonNode *pNode;
  const char *z = pParse->zJson;
  while( fast_isspace(z[i]) ){ i++; }
  if( (c = z[i])=='{' ){
    /* Parse object */
    iThis = jsonParseAddNode(pParse, JSON_OBJECT, 0, 0);
    if( iThis<0 ) return -1;
    for(j=i+1;;j++){
      while( fast_isspace(z[j]) ){ j++; }
      if( ++pParse->iDepth > JSON_MAX_DEPTH ) return -1;
      x = jsonParseValue(pParse, j);
      if( x<0 ){
        pParse->iDepth--;
        if( x==(-2) && pParse->nNode==(u32)iThis+1 ) return j+1;
        return -1;
      }
      if( pParse->oom ) return -1;
      pNode = &pParse->aNode[pParse->nNode-1];
      if( pNode->eType!=JSON_STRING ) return -1;
      pNode->jnFlags |= JNODE_LABEL;
      j = x;
      while( fast_isspace(z[j]) ){ j++; }
      if( z[j]!=':' ) return -1;
      j++;
      x = jsonParseValue(pParse, j);
      pParse->iDepth--;
      if( x<0 ) return -1;
      j = x;
      while( fast_isspace(z[j]) ){ j++; }
      c = z[j];
      if( c==',' ) continue;
      if( c!='}' ) return -1;
      break;
    }
    pParse->aNode[iThis].n = pParse->nNode - (u32)iThis - 1;
    return j+1;
  }else if( c=='[' ){
    /* Parse array */
    iThis = jsonParseAddNode(pParse, JSON_ARRAY, 0, 0);
    if( iThis<0 ) return -1;
    memset(&pParse->aNode[iThis].u, 0, sizeof(pParse->aNode[iThis].u));
    for(j=i+1;;j++){
      while( fast_isspace(z[j]) ){ j++; }
      if( ++pParse->iDepth > JSON_MAX_DEPTH ) return -1;
      x = jsonParseValue(pParse, j);
      pParse->iDepth--;
      if( x<0 ){
        if( x==(-3) && pParse->nNode==(u32)iThis+1 ) return j+1;
        return -1;
      }
      j = x;
      while( fast_isspace(z[j]) ){ j++; }
      c = z[j];
      if( c==',' ) continue;
      if( c!=']' ) return -1;
      break;
    }
    pParse->aNode[iThis].n = pParse->nNode - (u32)iThis - 1;
    return j+1;
  }else if( c=='"' ){
    /* Parse string */
    u8 jnFlags = 0;
    j = i+1;
    for(;;){
      c = z[j];
      if( (c & ~0x1f)==0 ){
        /* Control characters are not allowed in strings */
        return -1;
      }
      if( c=='\\' ){
        c = z[++j];
        if( c=='"' || c=='\\' || c=='/' || c=='b' || c=='f'
           || c=='n' || c=='r' || c=='t'
           || (c=='u' && jsonIs4Hex(z+j+1)) ){
          jnFlags = JNODE_ESCAPE;
        }else{
          return -1;
        }
      }else if( c=='"' ){
        break;
      }
      j++;
    }
    jsonParseAddNode(pParse, JSON_STRING, j+1-i, &z[i]);
    if( !pParse->oom ) pParse->aNode[pParse->nNode-1].jnFlags = jnFlags;
    return j+1;
  }else if( c=='n'
         && strncmp(z+i,"null",4)==0
         && !sqlite3Isalnum(z[i+4]) ){
    jsonParseAddNode(pParse, JSON_NULL, 0, 0);
    return i+4;
  }else if( c=='t'
         && strncmp(z+i,"true",4)==0
         && !sqlite3Isalnum(z[i+4]) ){
    jsonParseAddNode(pParse, JSON_TRUE, 0, 0);
    return i+4;
  }else if( c=='f'
         && strncmp(z+i,"false",5)==0
         && !sqlite3Isalnum(z[i+5]) ){
    jsonParseAddNode(pParse, JSON_FALSE, 0, 0);
    return i+5;
  }else if( c=='-' || (c>='0' && c<='9') ){
    /* Parse number */
    u8 seenDP = 0;
    u8 seenE = 0;
    assert( '-' < '0' );
    if( c<='0' ){
      j = c=='-' ? i+1 : i;
      if( z[j]=='0' && z[j+1]>='0' && z[j+1]<='9' ) return -1;
    }
    j = i+1;
    for(;; j++){
      c = z[j];
      if( c>='0' && c<='9' ) continue;
      if( c=='.' ){
        if( z[j-1]=='-' ) return -1;
        if( seenDP ) return -1;
        seenDP = 1;
        continue;
      }
      if( c=='e' || c=='E' ){
        if( z[j-1]<'0' ) return -1;
        if( seenE ) return -1;
        seenDP = seenE = 1;
        c = z[j+1];
        if( c=='+' || c=='-' ){
          j++;
          c = z[j+1];
        }
        if( c<'0' || c>'9' ) return -1;
        continue;
      }
      break;
    }
    if( z[j-1]<'0' ) return -1;
    jsonParseAddNode(pParse, seenDP ? JSON_REAL : JSON_INT,
                        j - i, &z[i]);
    return j;
  }else if( c=='}' ){
    return -2;  /* End of {...} */
  }else if( c==']' ){
    return -3;  /* End of [...] */
  }else if( c==0 ){
    return 0;   /* End of file */
  }else{
    return -1;  /* Syntax error */
  }
}